

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

ON_Curve * __thiscall ON_Extrusion::Profile(ON_Extrusion *this,int profile_index)

{
  ON_PolyCurve *this_00;
  ON_Extrusion *local_38;
  ON_PolyCurve *poly_profile;
  int profile_index_local;
  ON_Extrusion *this_local;
  
  if ((profile_index == 0) && (this->m_profile_count == 1)) {
    this_local = (ON_Extrusion *)this->m_profile;
  }
  else if ((profile_index < 0) || (this->m_profile_count < profile_index)) {
    this_local = (ON_Extrusion *)0x0;
  }
  else {
    this_00 = PolyProfile(this);
    if (this_00 == (ON_PolyCurve *)0x0) {
      local_38 = (ON_Extrusion *)0x0;
    }
    else {
      local_38 = (ON_Extrusion *)ON_PolyCurve::SegmentCurve(this_00,profile_index);
    }
    this_local = local_38;
  }
  return (ON_Curve *)this_local;
}

Assistant:

const ON_Curve* ON_Extrusion::Profile(int profile_index) const
{
  if ( 0 == profile_index && 1 == m_profile_count )
    return m_profile;
  if ( profile_index < 0 || profile_index > m_profile_count )
    return 0;
  const ON_PolyCurve* poly_profile = PolyProfile();
  return ( 0 != poly_profile ? poly_profile->SegmentCurve(profile_index) : 0 );
}